

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O2

int amqp_time_has_past(amqp_time_t time)

{
  int iVar1;
  uint64_t uVar2;
  
  if (time.time_point_ns == 0xffffffffffffffff) {
    return 0;
  }
  uVar2 = amqp_get_monotonic_timestamp();
  if (uVar2 == 0) {
    iVar1 = -0xe;
  }
  else {
    iVar1 = -0xd;
    if (uVar2 <= time.time_point_ns) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int amqp_time_has_past(amqp_time_t time) {
  uint64_t now_ns;
  if (UINT64_MAX == time.time_point_ns) {
    return AMQP_STATUS_OK;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns > time.time_point_ns) {
    return AMQP_STATUS_TIMEOUT;
  }
  return AMQP_STATUS_OK;
}